

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O3

void __thiscall uint256_tests::from_user_hex::test_method(from_user_hex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  readonly_property<bool> rVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  const_string file;
  const_string file_00;
  string_view input;
  const_string file_01;
  string_view input_00;
  const_string file_02;
  string_view input_01;
  const_string file_03;
  string_view input_02;
  const_string file_04;
  string_view input_03;
  const_string file_05;
  string_view input_04;
  const_string file_06;
  string_view input_05;
  const_string file_07;
  string_view input_06;
  const_string file_08;
  const_string file_09;
  string_view input_07;
  string_view str;
  const_string file_10;
  string_view input_08;
  string_view str_00;
  const_string file_11;
  string_view input_09;
  const_string file_12;
  string_view input_10;
  const_string file_13;
  string_view input_11;
  const_string file_14;
  string_view input_12;
  const_string file_15;
  string_view input_13;
  const_string file_16;
  string_view input_14;
  const_string file_17;
  string_view input_15;
  const_string file_18;
  string_view input_16;
  const_string file_19;
  string_view input_17;
  const_string file_20;
  string_view input_18;
  const_string file_21;
  string_view input_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  check_type cVar27;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  assertion_result local_198;
  char *local_180;
  assertion_result local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  undefined1 local_f8 [24];
  undefined1 local_e0 [9];
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  shared_count sStack_d0;
  undefined1 uStack_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 local_c0 [32];
  bool local_a0;
  string valid_hex_64;
  undefined1 local_78 [9];
  undefined1 auStack_6f [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_f8._8_8_ = local_f8._0_8_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12e;
  file.m_begin = (iterator)&local_1a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  detail::FromUserHex<uint256>
            ((optional<uint256> *)local_c0,(string_view)(ZEXT816(0xf4aea1) << 0x40));
  if (local_a0 == true) {
    auVar18[0] = -(local_c0[0] == '\0');
    auVar18[1] = -(local_c0[1] == '\0');
    auVar18[2] = -(local_c0[2] == '\0');
    auVar18[3] = -(local_c0[3] == '\0');
    auVar18[4] = -(local_c0[4] == '\0');
    auVar18[5] = -(local_c0[5] == '\0');
    auVar18[6] = -(local_c0[6] == '\0');
    auVar18[7] = -(local_c0[7] == '\0');
    auVar18[8] = -(local_c0[8] == '\0');
    auVar18[9] = -(local_c0[9] == '\0');
    auVar18[10] = -(local_c0[10] == '\0');
    auVar18[0xb] = -(local_c0[0xb] == '\0');
    auVar18[0xc] = -(local_c0[0xc] == '\0');
    auVar18[0xd] = -(local_c0[0xd] == '\0');
    auVar18[0xe] = -(local_c0[0xe] == '\0');
    auVar18[0xf] = -(local_c0[0xf] == '\0');
    auVar9[0] = -(local_c0[0x10] == '\0');
    auVar9[1] = -(local_c0[0x11] == '\0');
    auVar9[2] = -(local_c0[0x12] == '\0');
    auVar9[3] = -(local_c0[0x13] == '\0');
    auVar9[4] = -(local_c0[0x14] == '\0');
    auVar9[5] = -(local_c0[0x15] == '\0');
    auVar9[6] = -(local_c0[0x16] == '\0');
    auVar9[7] = -(local_c0[0x17] == '\0');
    auVar9[8] = -(local_c0[0x18] == '\0');
    auVar9[9] = -(local_c0[0x19] == '\0');
    auVar9[10] = -(local_c0[0x1a] == '\0');
    auVar9[0xb] = -(local_c0[0x1b] == '\0');
    auVar9[0xc] = -(local_c0[0x1c] == '\0');
    auVar9[0xd] = -(local_c0[0x1d] == '\0');
    auVar9[0xe] = -(local_c0[0x1e] == '\0');
    auVar9[0xf] = -(local_c0[0x1f] == '\0');
    auVar9 = auVar9 & auVar18;
    local_e0[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e0[0] = (class_property<bool>)false;
  }
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = "";
  __str.field_2._8_8_ = local_120;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_140;
  local_140._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(_auStack_6f << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf49563,
             (size_t)local_100,0x12e,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12f;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input._M_str = "0x";
  input._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input);
  if (local_a0 == true) {
    auVar19[0] = -(local_c0[0] == '\0');
    auVar19[1] = -(local_c0[1] == '\0');
    auVar19[2] = -(local_c0[2] == '\0');
    auVar19[3] = -(local_c0[3] == '\0');
    auVar19[4] = -(local_c0[4] == '\0');
    auVar19[5] = -(local_c0[5] == '\0');
    auVar19[6] = -(local_c0[6] == '\0');
    auVar19[7] = -(local_c0[7] == '\0');
    auVar19[8] = -(local_c0[8] == '\0');
    auVar19[9] = -(local_c0[9] == '\0');
    auVar19[10] = -(local_c0[10] == '\0');
    auVar19[0xb] = -(local_c0[0xb] == '\0');
    auVar19[0xc] = -(local_c0[0xc] == '\0');
    auVar19[0xd] = -(local_c0[0xd] == '\0');
    auVar19[0xe] = -(local_c0[0xe] == '\0');
    auVar19[0xf] = -(local_c0[0xf] == '\0');
    auVar10[0] = -(local_c0[0x10] == '\0');
    auVar10[1] = -(local_c0[0x11] == '\0');
    auVar10[2] = -(local_c0[0x12] == '\0');
    auVar10[3] = -(local_c0[0x13] == '\0');
    auVar10[4] = -(local_c0[0x14] == '\0');
    auVar10[5] = -(local_c0[0x15] == '\0');
    auVar10[6] = -(local_c0[0x16] == '\0');
    auVar10[7] = -(local_c0[0x17] == '\0');
    auVar10[8] = -(local_c0[0x18] == '\0');
    auVar10[9] = -(local_c0[0x19] == '\0');
    auVar10[10] = -(local_c0[0x1a] == '\0');
    auVar10[0xb] = -(local_c0[0x1b] == '\0');
    auVar10[0xc] = -(local_c0[0x1c] == '\0');
    auVar10[0xd] = -(local_c0[0x1d] == '\0');
    auVar10[0xe] = -(local_c0[0x1e] == '\0');
    auVar10[0xf] = -(local_c0[0x1f] == '\0');
    auVar10 = auVar10 & auVar19;
    local_e0[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e0[0] = (class_property<bool>)false;
  }
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_120;
  local_140._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_140;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf4958a,
             (size_t)local_100,0x12f,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x130;
  file_01.m_begin = (iterator)&local_1e8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
             msg_01);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_00._M_str = "0";
  input_00._M_len = 1;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_00);
  if (local_a0 == true) {
    auVar20[0] = -(local_c0[0] == '\0');
    auVar20[1] = -(local_c0[1] == '\0');
    auVar20[2] = -(local_c0[2] == '\0');
    auVar20[3] = -(local_c0[3] == '\0');
    auVar20[4] = -(local_c0[4] == '\0');
    auVar20[5] = -(local_c0[5] == '\0');
    auVar20[6] = -(local_c0[6] == '\0');
    auVar20[7] = -(local_c0[7] == '\0');
    auVar20[8] = -(local_c0[8] == '\0');
    auVar20[9] = -(local_c0[9] == '\0');
    auVar20[10] = -(local_c0[10] == '\0');
    auVar20[0xb] = -(local_c0[0xb] == '\0');
    auVar20[0xc] = -(local_c0[0xc] == '\0');
    auVar20[0xd] = -(local_c0[0xd] == '\0');
    auVar20[0xe] = -(local_c0[0xe] == '\0');
    auVar20[0xf] = -(local_c0[0xf] == '\0');
    auVar11[0] = -(local_c0[0x10] == '\0');
    auVar11[1] = -(local_c0[0x11] == '\0');
    auVar11[2] = -(local_c0[0x12] == '\0');
    auVar11[3] = -(local_c0[0x13] == '\0');
    auVar11[4] = -(local_c0[0x14] == '\0');
    auVar11[5] = -(local_c0[0x15] == '\0');
    auVar11[6] = -(local_c0[0x16] == '\0');
    auVar11[7] = -(local_c0[0x17] == '\0');
    auVar11[8] = -(local_c0[0x18] == '\0');
    auVar11[9] = -(local_c0[0x19] == '\0');
    auVar11[10] = -(local_c0[0x1a] == '\0');
    auVar11[0xb] = -(local_c0[0x1b] == '\0');
    auVar11[0xc] = -(local_c0[0x1c] == '\0');
    auVar11[0xd] = -(local_c0[0x1d] == '\0');
    auVar11[0xe] = -(local_c0[0x1e] == '\0');
    auVar11[0xf] = -(local_c0[0x1f] == '\0');
    auVar11 = auVar11 & auVar20;
    local_e0[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e0[0] = (class_property<bool>)false;
  }
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_120;
  local_140._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_140;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf495a5,
             (size_t)local_100,0x130,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_208;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_218,
             msg_02);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_01._M_str = "00";
  input_01._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_01);
  if (local_a0 == true) {
    auVar21[0] = -(local_c0[0] == '\0');
    auVar21[1] = -(local_c0[1] == '\0');
    auVar21[2] = -(local_c0[2] == '\0');
    auVar21[3] = -(local_c0[3] == '\0');
    auVar21[4] = -(local_c0[4] == '\0');
    auVar21[5] = -(local_c0[5] == '\0');
    auVar21[6] = -(local_c0[6] == '\0');
    auVar21[7] = -(local_c0[7] == '\0');
    auVar21[8] = -(local_c0[8] == '\0');
    auVar21[9] = -(local_c0[9] == '\0');
    auVar21[10] = -(local_c0[10] == '\0');
    auVar21[0xb] = -(local_c0[0xb] == '\0');
    auVar21[0xc] = -(local_c0[0xc] == '\0');
    auVar21[0xd] = -(local_c0[0xd] == '\0');
    auVar21[0xe] = -(local_c0[0xe] == '\0');
    auVar21[0xf] = -(local_c0[0xf] == '\0');
    auVar12[0] = -(local_c0[0x10] == '\0');
    auVar12[1] = -(local_c0[0x11] == '\0');
    auVar12[2] = -(local_c0[0x12] == '\0');
    auVar12[3] = -(local_c0[0x13] == '\0');
    auVar12[4] = -(local_c0[0x14] == '\0');
    auVar12[5] = -(local_c0[0x15] == '\0');
    auVar12[6] = -(local_c0[0x16] == '\0');
    auVar12[7] = -(local_c0[0x17] == '\0');
    auVar12[8] = -(local_c0[0x18] == '\0');
    auVar12[9] = -(local_c0[0x19] == '\0');
    auVar12[10] = -(local_c0[0x1a] == '\0');
    auVar12[0xb] = -(local_c0[0x1b] == '\0');
    auVar12[0xc] = -(local_c0[0x1c] == '\0');
    auVar12[0xd] = -(local_c0[0x1d] == '\0');
    auVar12[0xe] = -(local_c0[0x1e] == '\0');
    auVar12[0xf] = -(local_c0[0x1f] == '\0');
    auVar12 = auVar12 & auVar21;
    local_e0[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e0[0] = (class_property<bool>)false;
  }
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_120;
  local_140._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_140;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf495bf,
             (size_t)local_100,0x131,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x132;
  file_03.m_begin = (iterator)&local_228;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_238,
             msg_03);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_02._M_str = "1";
  input_02._M_len = 1;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_02);
  if (local_a0 == true) {
    auVar22[0] = -(local_c0[0] == '\x01');
    auVar22[1] = -(local_c0[1] == '\0');
    auVar22[2] = -(local_c0[2] == '\0');
    auVar22[3] = -(local_c0[3] == '\0');
    auVar22[4] = -(local_c0[4] == '\0');
    auVar22[5] = -(local_c0[5] == '\0');
    auVar22[6] = -(local_c0[6] == '\0');
    auVar22[7] = -(local_c0[7] == '\0');
    auVar22[8] = -(local_c0[8] == '\0');
    auVar22[9] = -(local_c0[9] == '\0');
    auVar22[10] = -(local_c0[10] == '\0');
    auVar22[0xb] = -(local_c0[0xb] == '\0');
    auVar22[0xc] = -(local_c0[0xc] == '\0');
    auVar22[0xd] = -(local_c0[0xd] == '\0');
    auVar22[0xe] = -(local_c0[0xe] == '\0');
    auVar22[0xf] = -(local_c0[0xf] == '\0');
    auVar13[0] = -(local_c0[0x10] == '\0');
    auVar13[1] = -(local_c0[0x11] == '\0');
    auVar13[2] = -(local_c0[0x12] == '\0');
    auVar13[3] = -(local_c0[0x13] == '\0');
    auVar13[4] = -(local_c0[0x14] == '\0');
    auVar13[5] = -(local_c0[0x15] == '\0');
    auVar13[6] = -(local_c0[0x16] == '\0');
    auVar13[7] = -(local_c0[0x17] == '\0');
    auVar13[8] = -(local_c0[0x18] == '\0');
    auVar13[9] = -(local_c0[0x19] == '\0');
    auVar13[10] = -(local_c0[0x1a] == '\0');
    auVar13[0xb] = -(local_c0[0x1b] == '\0');
    auVar13[0xc] = -(local_c0[0x1c] == '\0');
    auVar13[0xd] = -(local_c0[0x1d] == '\0');
    auVar13[0xe] = -(local_c0[0x1e] == '\0');
    auVar13[0xf] = -(local_c0[0x1f] == '\0');
    auVar13 = auVar13 & auVar22;
    local_e0[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e0[0] = (class_property<bool>)false;
  }
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = (element_type *)0xf48bcd;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_120;
  local_140._M_dataplus._M_p = (pointer)&uint256::ONE;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_140;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_120._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf495da,
             (size_t)local_100,0x132,&__str,"uint256::ONE",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x133;
  file_04.m_begin = (iterator)&local_248;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_258,
             msg_04);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_03._M_str = "0x10";
  input_03._M_len = 4;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_03);
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  uStack_c6 = 0;
  uStack_c5 = 0;
  uStack_c4 = 0;
  uStack_c3 = 0;
  uStack_c2 = 0;
  uStack_c1 = 0;
  local_e0[1] = 0;
  local_e0[2] = 0;
  local_e0[3] = 0;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  local_e0[0] = (class_property<bool>)0x10;
  if (local_a0 == true) {
    auVar23[0] = -(local_c0[0] == '\x10');
    auVar23[1] = -(local_c0[1] == '\0');
    auVar23[2] = -(local_c0[2] == '\0');
    auVar23[3] = -(local_c0[3] == '\0');
    auVar23[4] = -(local_c0[4] == '\0');
    auVar23[5] = -(local_c0[5] == '\0');
    auVar23[6] = -(local_c0[6] == '\0');
    auVar23[7] = -(local_c0[7] == '\0');
    auVar23[8] = -(local_c0[8] == '\0');
    auVar23[9] = -(local_c0[9] == '\0');
    auVar23[10] = -(local_c0[10] == '\0');
    auVar23[0xb] = -(local_c0[0xb] == '\0');
    auVar23[0xc] = -(local_c0[0xc] == '\0');
    auVar23[0xd] = -(local_c0[0xd] == '\0');
    auVar23[0xe] = -(local_c0[0xe] == '\0');
    auVar23[0xf] = -(local_c0[0xf] == '\0');
    auVar14[0] = -(local_c0[0x10] == '\0');
    auVar14[1] = -(local_c0[0x11] == '\0');
    auVar14[2] = -(local_c0[0x12] == '\0');
    auVar14[3] = -(local_c0[0x13] == '\0');
    auVar14[4] = -(local_c0[0x14] == '\0');
    auVar14[5] = -(local_c0[0x15] == '\0');
    auVar14[6] = -(local_c0[0x16] == '\0');
    auVar14[7] = -(local_c0[0x17] == '\0');
    auVar14[8] = -(local_c0[0x18] == '\0');
    auVar14[9] = -(local_c0[0x19] == '\0');
    auVar14[10] = -(local_c0[0x1a] == '\0');
    auVar14[0xb] = -(local_c0[0x1b] == '\0');
    auVar14[0xc] = -(local_c0[0x1c] == '\0');
    auVar14[0xd] = -(local_c0[0x1d] == '\0');
    auVar14[0xe] = -(local_c0[0x1e] == '\0');
    auVar14[0xf] = -(local_c0[0x1f] == '\0');
    auVar14 = auVar14 & auVar23;
    rVar8.super_class_property<bool>.value =
         (class_property<bool>)
         ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    rVar8.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (sp_counted_base *)0x0;
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_120._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_140;
  aStack_68._8_8_ = &local_160;
  local_160._M_dataplus._M_p = local_e0;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_140._M_dataplus._M_p = (pointer)local_c0;
  local_100[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf49606,
             (size_t)local_120,0x133,&__str,"uint256{0x10}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 8));
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x134;
  file_05.m_begin = (iterator)&local_268;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_278,
             msg_05);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_04._M_str = "10";
  input_04._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_04);
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  uStack_c6 = 0;
  uStack_c5 = 0;
  uStack_c4 = 0;
  uStack_c3 = 0;
  uStack_c2 = 0;
  uStack_c1 = 0;
  local_e0[1] = 0;
  local_e0[2] = 0;
  local_e0[3] = 0;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  local_e0[0] = (class_property<bool>)0x10;
  if (local_a0 == true) {
    auVar24[0] = -(local_c0[0] == '\x10');
    auVar24[1] = -(local_c0[1] == '\0');
    auVar24[2] = -(local_c0[2] == '\0');
    auVar24[3] = -(local_c0[3] == '\0');
    auVar24[4] = -(local_c0[4] == '\0');
    auVar24[5] = -(local_c0[5] == '\0');
    auVar24[6] = -(local_c0[6] == '\0');
    auVar24[7] = -(local_c0[7] == '\0');
    auVar24[8] = -(local_c0[8] == '\0');
    auVar24[9] = -(local_c0[9] == '\0');
    auVar24[10] = -(local_c0[10] == '\0');
    auVar24[0xb] = -(local_c0[0xb] == '\0');
    auVar24[0xc] = -(local_c0[0xc] == '\0');
    auVar24[0xd] = -(local_c0[0xd] == '\0');
    auVar24[0xe] = -(local_c0[0xe] == '\0');
    auVar24[0xf] = -(local_c0[0xf] == '\0');
    auVar15[0] = -(local_c0[0x10] == '\0');
    auVar15[1] = -(local_c0[0x11] == '\0');
    auVar15[2] = -(local_c0[0x12] == '\0');
    auVar15[3] = -(local_c0[0x13] == '\0');
    auVar15[4] = -(local_c0[0x14] == '\0');
    auVar15[5] = -(local_c0[0x15] == '\0');
    auVar15[6] = -(local_c0[0x16] == '\0');
    auVar15[7] = -(local_c0[0x17] == '\0');
    auVar15[8] = -(local_c0[0x18] == '\0');
    auVar15[9] = -(local_c0[0x19] == '\0');
    auVar15[10] = -(local_c0[0x1a] == '\0');
    auVar15[0xb] = -(local_c0[0x1b] == '\0');
    auVar15[0xc] = -(local_c0[0x1c] == '\0');
    auVar15[0xd] = -(local_c0[0x1d] == '\0');
    auVar15[0xe] = -(local_c0[0x1e] == '\0');
    auVar15[0xf] = -(local_c0[0x1f] == '\0');
    auVar15 = auVar15 & auVar24;
    local_100[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_100[0] = (class_property<bool>)false;
  }
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (sp_counted_base *)0x0;
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_120._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_140;
  local_160._M_dataplus._M_p = local_e0;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_160;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_140._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf49631,
             (size_t)local_120,0x134,&__str,"uint256{0x10}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 8));
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x135;
  file_06.m_begin = (iterator)&local_288;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_298,
             msg_06);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_05._M_str = "0xFf";
  input_05._M_len = 4;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_05);
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  uStack_c6 = 0;
  uStack_c5 = 0;
  uStack_c4 = 0;
  uStack_c3 = 0;
  uStack_c2 = 0;
  uStack_c1 = 0;
  local_e0[1] = 0;
  local_e0[2] = 0;
  local_e0[3] = 0;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  local_e0[0] = (class_property<bool>)0xff;
  if (local_a0 == true) {
    auVar25[0] = -(local_c0[0] == 0xff);
    auVar25[1] = -(local_c0[1] == '\0');
    auVar25[2] = -(local_c0[2] == '\0');
    auVar25[3] = -(local_c0[3] == '\0');
    auVar25[4] = -(local_c0[4] == '\0');
    auVar25[5] = -(local_c0[5] == '\0');
    auVar25[6] = -(local_c0[6] == '\0');
    auVar25[7] = -(local_c0[7] == '\0');
    auVar25[8] = -(local_c0[8] == '\0');
    auVar25[9] = -(local_c0[9] == '\0');
    auVar25[10] = -(local_c0[10] == '\0');
    auVar25[0xb] = -(local_c0[0xb] == '\0');
    auVar25[0xc] = -(local_c0[0xc] == '\0');
    auVar25[0xd] = -(local_c0[0xd] == '\0');
    auVar25[0xe] = -(local_c0[0xe] == '\0');
    auVar25[0xf] = -(local_c0[0xf] == '\0');
    auVar16[0] = -(local_c0[0x10] == '\0');
    auVar16[1] = -(local_c0[0x11] == '\0');
    auVar16[2] = -(local_c0[0x12] == '\0');
    auVar16[3] = -(local_c0[0x13] == '\0');
    auVar16[4] = -(local_c0[0x14] == '\0');
    auVar16[5] = -(local_c0[0x15] == '\0');
    auVar16[6] = -(local_c0[0x16] == '\0');
    auVar16[7] = -(local_c0[0x17] == '\0');
    auVar16[8] = -(local_c0[0x18] == '\0');
    auVar16[9] = -(local_c0[0x19] == '\0');
    auVar16[10] = -(local_c0[0x1a] == '\0');
    auVar16[0xb] = -(local_c0[0x1b] == '\0');
    auVar16[0xc] = -(local_c0[0x1c] == '\0');
    auVar16[0xd] = -(local_c0[0x1d] == '\0');
    auVar16[0xe] = -(local_c0[0x1e] == '\0');
    auVar16[0xf] = -(local_c0[0x1f] == '\0');
    auVar16 = auVar16 & auVar25;
    local_100[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_100[0] = (class_property<bool>)false;
  }
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (sp_counted_base *)0x0;
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_120._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_140;
  local_160._M_dataplus._M_p = local_e0;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_160;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_140._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf49651,
             (size_t)local_120,0x135,&__str,"uint256{0xff}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 8));
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x136;
  file_07.m_begin = (iterator)&local_2a8;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2b8,
             msg_07);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_06._M_str = "Ff";
  input_06._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_06);
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  uStack_c6 = 0;
  uStack_c5 = 0;
  uStack_c4 = 0;
  uStack_c3 = 0;
  uStack_c2 = 0;
  uStack_c1 = 0;
  local_e0[1] = 0;
  local_e0[2] = 0;
  local_e0[3] = 0;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  local_e0[0] = (class_property<bool>)0xff;
  if (local_a0 == true) {
    auVar26[0] = -(local_c0[0] == 0xff);
    auVar26[1] = -(local_c0[1] == '\0');
    auVar26[2] = -(local_c0[2] == '\0');
    auVar26[3] = -(local_c0[3] == '\0');
    auVar26[4] = -(local_c0[4] == '\0');
    auVar26[5] = -(local_c0[5] == '\0');
    auVar26[6] = -(local_c0[6] == '\0');
    auVar26[7] = -(local_c0[7] == '\0');
    auVar26[8] = -(local_c0[8] == '\0');
    auVar26[9] = -(local_c0[9] == '\0');
    auVar26[10] = -(local_c0[10] == '\0');
    auVar26[0xb] = -(local_c0[0xb] == '\0');
    auVar26[0xc] = -(local_c0[0xc] == '\0');
    auVar26[0xd] = -(local_c0[0xd] == '\0');
    auVar26[0xe] = -(local_c0[0xe] == '\0');
    auVar26[0xf] = -(local_c0[0xf] == '\0');
    auVar17[0] = -(local_c0[0x10] == '\0');
    auVar17[1] = -(local_c0[0x11] == '\0');
    auVar17[2] = -(local_c0[0x12] == '\0');
    auVar17[3] = -(local_c0[0x13] == '\0');
    auVar17[4] = -(local_c0[0x14] == '\0');
    auVar17[5] = -(local_c0[0x15] == '\0');
    auVar17[6] = -(local_c0[0x16] == '\0');
    auVar17[7] = -(local_c0[0x17] == '\0');
    auVar17[8] = -(local_c0[0x18] == '\0');
    auVar17[9] = -(local_c0[0x19] == '\0');
    auVar17[10] = -(local_c0[0x1a] == '\0');
    auVar17[0xb] = -(local_c0[0x1b] == '\0');
    auVar17[0xc] = -(local_c0[0x1c] == '\0');
    auVar17[0xd] = -(local_c0[0x1d] == '\0');
    auVar17[0xe] = -(local_c0[0x1e] == '\0');
    auVar17[0xf] = -(local_c0[0x1f] == '\0');
    auVar17 = auVar17 & auVar26;
    local_100[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_100[0] = (class_property<bool>)false;
  }
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (sp_counted_base *)0x0;
  local_120._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_120._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0138e440;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_140;
  local_160._M_dataplus._M_p = local_e0;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_160;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_140._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf4967c,
             (size_t)local_120,0x136,&__str,"uint256{0xff}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 8));
  valid_hex_64._M_dataplus._M_p = (pointer)&valid_hex_64.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&valid_hex_64,
             "0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF","");
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x138;
  file_08.m_begin = (iterator)&local_2c8;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2d8,
             msg_08);
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_01388f08;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_160._M_dataplus._M_p =
       (pointer)CONCAT71(valid_hex_64._M_string_length._1_7_,
                         (undefined1)valid_hex_64._M_string_length);
  local_140._M_dataplus._M_p = (pointer)&local_178;
  local_178.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x42;
  local_178._1_3_ = 0;
  local_e0[0] = (class_property<bool>)(local_160._M_dataplus._M_p == (char *)0x42);
  local_e0[8] = false;
  uStack_d7 = 0;
  uStack_d6 = 0;
  uStack_d5 = 0;
  uStack_d4 = 0;
  uStack_d3 = 0;
  uStack_d2 = 0;
  uStack_d1 = 0;
  sStack_d0.pi_._0_1_ = 0;
  sStack_d0.pi_._1_1_ = 0;
  sStack_d0.pi_._2_1_ = 0;
  sStack_d0.pi_._3_1_ = 0;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  local_100 = (undefined1  [8])0xf48b67;
  local_f8._0_8_ = (element_type *)0xf48bcd;
  local_120._0_8_ = &local_160;
  local_c0[8] = '\0';
  local_c0._0_8_ = &PTR__lazy_ostream_01388f48;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013890c8;
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_140;
  pvVar6 = (iterator)0x2;
  pvVar7 = (iterator)0x2;
  local_c0._24_8_ = local_120;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e0,(lazy_ostream *)local_78,2,2,REQUIRE,0xf496da,
             (size_t)local_100,0x138,(optional<uint256> *)local_c0,"2 + 64",&__str);
  boost::detail::shared_count::~shared_count(&sStack_d0);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x139;
  file_09.m_begin = (iterator)&local_2e8;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2f8,
             msg_09);
  local_e0[8] = false;
  local_e0[0] = (class_property<bool>)0x8;
  local_e0[1] = 0x8f;
  local_e0[2] = 0x38;
  local_e0[3] = 1;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  sStack_d0.pi_._0_1_ = 0x38;
  sStack_d0.pi_._1_1_ = 0xd1;
  sStack_d0.pi_._2_1_ = 0x39;
  sStack_d0.pi_._3_1_ = 1;
  sStack_d0.pi_._4_1_ = 0;
  sStack_d0.pi_._5_1_ = 0;
  sStack_d0.pi_._6_1_ = 0;
  sStack_d0.pi_._7_1_ = 0;
  uStack_c8 = 0xa1;
  uStack_c7 = 0xae;
  uStack_c6 = 0xf4;
  uStack_c5 = 0;
  uStack_c4 = 0;
  uStack_c3 = 0;
  uStack_c2 = 0;
  uStack_c1 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
             &valid_hex_64,2,0xffffffffffffffff);
  input_07._M_str = (char *)local_120._0_8_;
  input_07._M_len = local_120._8_8_;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_07);
  if (local_a0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)local_100,local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_160,&valid_hex_64,2,0xffffffffffffffff);
    str._M_str = local_160._M_dataplus._M_p;
    str._M_len = local_160._M_string_length;
    ToLower_abi_cxx11_(&local_140,str);
    if (local_f8._0_8_ == local_140._M_string_length) {
      if ((element_type *)local_f8._0_8_ == (element_type *)0x0) {
        rVar8.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        iVar3 = bcmp((void *)local_100,local_140._M_dataplus._M_p,local_f8._0_8_);
        rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar3 == 0);
      }
    }
    else {
      rVar8.super_class_property<bool>.value = (class_property<bool>)false;
    }
    local_178.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
    local_178.m_message.px = (element_type *)0x0;
    local_178.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_198.m_message.pn.pi_ = (sp_counted_base *)0xf48b67;
    local_180 = "";
    __str.field_2._8_8_ = &local_198.m_message;
    __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
    __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
    __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = &local_198;
    stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
    local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_198._0_8_ = &local_140;
    local_198.m_message.px = (element_type *)local_100;
    boost::test_tools::tt_detail::report_assertion
              (&local_178,(lazy_ostream *)local_e0,1,2,REQUIRE,0xf496f5,
               (size_t)&local_198.m_message.pn,0x139,&__str,"ToLower(valid_hex_64.substr(2))",
               local_78);
    boost::detail::shared_count::~shared_count(&local_178.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != (undefined1  [8])(local_f8 + 8)) {
      operator_delete((void *)local_100,(ulong)(local_f8._8_8_ + 1));
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x13a;
    file_10.m_begin = (iterator)&local_308;
    msg_10.m_end = pvVar7;
    msg_10.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_318,
               msg_10);
    local_e0[8] = false;
    local_e0[0] = (class_property<bool>)0x8;
    local_e0[1] = 0x8f;
    local_e0[2] = 0x38;
    local_e0[3] = 1;
    local_e0[4] = 0;
    local_e0[5] = 0;
    local_e0[6] = 0;
    local_e0[7] = 0;
    sStack_d0.pi_._0_1_ = 0x38;
    sStack_d0.pi_._1_1_ = 0xd1;
    sStack_d0.pi_._2_1_ = 0x39;
    sStack_d0.pi_._3_1_ = 1;
    sStack_d0.pi_._4_1_ = 0;
    sStack_d0.pi_._5_1_ = 0;
    sStack_d0.pi_._6_1_ = 0;
    sStack_d0.pi_._7_1_ = 0;
    uStack_c8 = 0xa1;
    uStack_c7 = 0xae;
    uStack_c6 = 0xf4;
    uStack_c5 = 0;
    uStack_c4 = 0;
    uStack_c3 = 0;
    uStack_c2 = 0;
    uStack_c1 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
               &valid_hex_64,0,0xffffffffffffffff);
    input_08._M_str = (char *)local_120._0_8_;
    input_08._M_len = local_120._8_8_;
    detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_08);
    if (local_a0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_((string *)local_100,local_c0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_160,&valid_hex_64,2,0xffffffffffffffff);
      str_00._M_str = local_160._M_dataplus._M_p;
      str_00._M_len = local_160._M_string_length;
      ToLower_abi_cxx11_(&local_140,str_00);
      if (local_f8._0_8_ == local_140._M_string_length) {
        if ((element_type *)local_f8._0_8_ == (element_type *)0x0) {
          rVar8.super_class_property<bool>.value = (class_property<bool>)true;
        }
        else {
          iVar3 = bcmp((void *)local_100,local_140._M_dataplus._M_p,local_f8._0_8_);
          rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar3 == 0);
        }
      }
      else {
        rVar8.super_class_property<bool>.value = (class_property<bool>)false;
      }
      local_178.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
      local_178.m_message.px = (element_type *)0x0;
      local_178.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_198.m_message.pn.pi_ = (sp_counted_base *)0xf48b67;
      local_180 = "";
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      __str.field_2._8_8_ = &local_198.m_message;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_68._8_8_ = &local_198;
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x2;
      local_198._0_8_ = &local_140;
      local_198.m_message.px = (element_type *)local_100;
      boost::test_tools::tt_detail::report_assertion
                (&local_178,(lazy_ostream *)local_e0,1,2,REQUIRE,0xf49755,
                 (size_t)&local_198.m_message.pn,0x13a,&__str,"ToLower(valid_hex_64.substr(2))",
                 local_78);
      boost::detail::shared_count::~shared_count(&local_178.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != (undefined1  [8])(local_f8 + 8)) {
        operator_delete((void *)local_100,(ulong)(local_f8._8_8_ + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      local_328 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_320 = "";
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      local_330 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x13c;
      file_11.m_begin = (iterator)&local_328;
      msg_11.m_end = pvVar7;
      msg_11.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_338,
                 msg_11);
      _cVar27 = 0x6d4d34;
      input_09._M_str = "0x0 ";
      input_09._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_09);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0x9a;
      local_e0[1] = 0x97;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x97;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_348 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_340 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_348,0x13c);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_350 = "";
      local_368 = &boost::unit_test::basic_cstring<char_const>::null;
      local_360 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x13d;
      file_12.m_begin = (iterator)&local_358;
      msg_12.m_end = pvVar7;
      msg_12.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_368,
                 msg_12);
      _cVar27 = 0x6d4e1d;
      input_10._M_str = " 0x0";
      input_10._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_10);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0xbd;
      local_e0[1] = 0x97;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x97;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_378 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_370 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_378,0x13d);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_380 = "";
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      local_390 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x13e;
      file_13.m_begin = (iterator)&local_388;
      msg_13.m_end = pvVar7;
      msg_13.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_398,
                 msg_13);
      _cVar27 = 0x6d4f06;
      input_11._M_str = "0x 0";
      input_11._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_11);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0xe0;
      local_e0[1] = 0x97;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x97;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_3a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3a0 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_3a8,0x13e);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_3b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3b0 = "";
      local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_14.m_end = (iterator)0x13f;
      file_14.m_begin = (iterator)&local_3b8;
      msg_14.m_end = pvVar7;
      msg_14.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c8,
                 msg_14);
      _cVar27 = 0x6d4fef;
      input_12._M_str = " ";
      input_12._M_len = 1;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_12);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0xfe;
      local_e0[1] = 0x97;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x98;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_3d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3d0 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_3d8,0x13f);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_3e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3e0 = "";
      local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x140;
      file_15.m_begin = (iterator)&local_3e8;
      msg_15.m_end = pvVar7;
      msg_15.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3f8,
                 msg_15);
      _cVar27 = 0x6d50d8;
      input_13._M_str = "0x0ga";
      input_13._M_len = 5;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_13);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0x1f;
      local_e0[1] = 0x98;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x98;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_408 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_400 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_408,0x140);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_418 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_410 = "";
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      local_420 = &boost::unit_test::basic_cstring<char_const>::null;
      file_16.m_end = (iterator)0x141;
      file_16.m_begin = (iterator)&local_418;
      msg_16.m_end = pvVar7;
      msg_16.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_428,
                 msg_16);
      _cVar27 = 0x6d51c1;
      input_14._M_str = "x0";
      input_14._M_len = 2;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_14);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0x3e;
      local_e0[1] = 0x98;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x98;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_438 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_430 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_438,0x141);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_448 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_440 = "";
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      local_450 = &boost::unit_test::basic_cstring<char_const>::null;
      file_17.m_end = (iterator)0x142;
      file_17.m_begin = (iterator)&local_448;
      msg_17.m_end = pvVar7;
      msg_17.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_458,
                 msg_17);
      _cVar27 = 0x6d52aa;
      input_15._M_str = "0x0x00";
      input_15._M_len = 6;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_15);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e0[0] = (class_property<bool>)0x61;
      local_e0[1] = 0x98;
      local_e0[2] = 0xf4;
      local_e0[3] = 0;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      local_e0[8] = true;
      uStack_d7 = 0x98;
      uStack_d6 = 0xf4;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_468 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_460 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_468,0x142);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_478 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_470 = "";
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      local_480 = &boost::unit_test::basic_cstring<char_const>::null;
      file_18.m_end = (iterator)0x143;
      file_18.m_begin = (iterator)&local_478;
      msg_18.m_end = pvVar7;
      msg_18.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_488,
                 msg_18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &valid_hex_64,2,0xffffffffffffffff);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "0");
      paVar1 = &__str.field_2;
      __str._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p == paVar5) {
        __str.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        __str.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        __str._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      __str._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      _cVar27 = 0x6d542b;
      input_16._M_str = __str._M_dataplus._M_p;
      input_16._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_16);
      local_100 = (undefined1  [8])(CONCAT71(local_100._1_7_,local_a0) ^ 1);
      local_f8._0_8_ = (element_type *)0x0;
      local_f8._8_8_ = (sp_counted_base *)0x0;
      local_120._0_8_ = "!uint256::FromUserHex(valid_hex_64.substr(2) + \"0\")";
      local_120._8_8_ = "";
      local_e0[8] = false;
      local_e0[0] = (class_property<bool>)0x48;
      local_e0[1] = 0x90;
      local_e0[2] = 0x38;
      local_e0[3] = 1;
      local_e0[4] = 0;
      local_e0[5] = 0;
      local_e0[6] = 0;
      local_e0[7] = 0;
      sStack_d0.pi_._0_1_ = 0x38;
      sStack_d0.pi_._1_1_ = 0xd1;
      sStack_d0.pi_._2_1_ = 0x39;
      sStack_d0.pi_._3_1_ = 1;
      sStack_d0.pi_._4_1_ = 0;
      sStack_d0.pi_._5_1_ = 0;
      sStack_d0.pi_._6_1_ = 0;
      sStack_d0.pi_._7_1_ = 0;
      uStack_c8 = SUB81(local_120,0);
      uStack_c7 = (undefined1)((ulong)local_120 >> 8);
      uStack_c6 = (undefined1)((ulong)local_120 >> 0x10);
      uStack_c5 = (undefined1)((ulong)local_120 >> 0x18);
      uStack_c4 = (undefined1)((ulong)local_120 >> 0x20);
      uStack_c3 = (undefined1)((ulong)local_120 >> 0x28);
      uStack_c2 = (undefined1)((ulong)local_120 >> 0x30);
      uStack_c1 = (undefined1)((ulong)local_120 >> 0x38);
      local_498 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_490 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_100,(lazy_ostream *)local_e0,1,0,WARN,_cVar27,
                 (size_t)&local_498,0x143);
      boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &aStack_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
      }
      local_4a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4a0 = "";
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_19.m_end = (iterator)0x144;
      file_19.m_begin = (iterator)&local_4a8;
      msg_19.m_end = pvVar7;
      msg_19.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4b8,
                 msg_19);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str,"a");
      _cVar27 = 0x6d559a;
      input_17._M_str = __str._M_dataplus._M_p;
      input_17._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_17);
      local_e0[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e0[8] = false;
      uStack_d7 = 0;
      uStack_d6 = 0;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      sStack_d0.pi_._0_1_ = 0;
      sStack_d0.pi_._1_1_ = 0;
      sStack_d0.pi_._2_1_ = 0;
      sStack_d0.pi_._3_1_ = 0;
      sStack_d0.pi_._4_1_ = 0;
      sStack_d0.pi_._5_1_ = 0;
      sStack_d0.pi_._6_1_ = 0;
      sStack_d0.pi_._7_1_ = 0;
      local_100 = (undefined1  [8])0xf498b5;
      local_f8._0_8_ = (element_type *)0xf498de;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_01389048;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_4c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4c0 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      aStack_68._8_8_ = (assertion_result *)local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_4c8,0x144);
      boost::detail::shared_count::~shared_count(&sStack_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      local_4d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4d0 = "";
      local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_20.m_end = (iterator)0x145;
      file_20.m_begin = (iterator)&local_4d8;
      msg_20.m_end = pvVar7;
      msg_20.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4e8,
                 msg_20);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str," ");
      _cVar27 = 0x6d56d9;
      input_18._M_str = __str._M_dataplus._M_p;
      input_18._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_18);
      local_e0[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e0[8] = false;
      uStack_d7 = 0;
      uStack_d6 = 0;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      sStack_d0.pi_._0_1_ = 0;
      sStack_d0.pi_._1_1_ = 0;
      sStack_d0.pi_._2_1_ = 0;
      sStack_d0.pi_._3_1_ = 0;
      sStack_d0.pi_._4_1_ = 0;
      sStack_d0.pi_._5_1_ = 0;
      sStack_d0.pi_._6_1_ = 0;
      sStack_d0.pi_._7_1_ = 0;
      local_100 = (undefined1  [8])0xf498df;
      local_f8._0_8_ = (element_type *)0xf49908;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_01389048;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_4f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4f0 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      aStack_68._8_8_ = (assertion_result *)local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_4f8,0x145);
      boost::detail::shared_count::~shared_count(&sStack_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      local_508 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_500 = "";
      local_518 = &boost::unit_test::basic_cstring<char_const>::null;
      local_510 = &boost::unit_test::basic_cstring<char_const>::null;
      file_21.m_end = (iterator)0x146;
      file_21.m_begin = (iterator)&local_508;
      msg_21.m_end = pvVar7;
      msg_21.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_518,
                 msg_21);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str,"z");
      _cVar27 = 0x6d5818;
      input_19._M_str = __str._M_dataplus._M_p;
      input_19._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_19);
      local_e0[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e0[8] = false;
      uStack_d7 = 0;
      uStack_d6 = 0;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      sStack_d0.pi_._0_1_ = 0;
      sStack_d0.pi_._1_1_ = 0;
      sStack_d0.pi_._2_1_ = 0;
      sStack_d0.pi_._3_1_ = 0;
      sStack_d0.pi_._4_1_ = 0;
      sStack_d0.pi_._5_1_ = 0;
      sStack_d0.pi_._6_1_ = 0;
      sStack_d0.pi_._7_1_ = 0;
      local_100 = (undefined1  [8])0xf49909;
      local_f8._0_8_ = (element_type *)0xf49932;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_01389048;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_528 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_520 = "";
      aStack_68._8_8_ = (assertion_result *)local_100;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e0,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_528,0x146);
      boost::detail::shared_count::~shared_count(&sStack_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)valid_hex_64._M_dataplus._M_p != &valid_hex_64.field_2) {
        operator_delete(valid_hex_64._M_dataplus._M_p,valid_hex_64.field_2._M_allocated_capacity + 1
                       );
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(from_user_hex)
{
    BOOST_CHECK_EQUAL(uint256::FromUserHex(""), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("00"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("1"), uint256::ONE);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0xFf"), uint256{0xff});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("Ff"), uint256{0xff});
    const std::string valid_hex_64{"0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF"};
    BOOST_REQUIRE_EQUAL(valid_hex_64.size(), 2 + 64); // 0x prefix and 64 hex digits
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString(), ToLower(valid_hex_64.substr(2)));
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString(), ToLower(valid_hex_64.substr(2)));

    BOOST_CHECK(!uint256::FromUserHex("0x0 "));                       // no spaces at end,
    BOOST_CHECK(!uint256::FromUserHex(" 0x0"));                       // or beginning,
    BOOST_CHECK(!uint256::FromUserHex("0x 0"));                       // or middle,
    BOOST_CHECK(!uint256::FromUserHex(" "));                          // etc.
    BOOST_CHECK(!uint256::FromUserHex("0x0ga"));                      // invalid character
    BOOST_CHECK(!uint256::FromUserHex("x0"));                         // broken prefix
    BOOST_CHECK(!uint256::FromUserHex("0x0x00"));                     // two prefixes not allowed
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64.substr(2) + "0")); // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "a"));           // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + " "));           // whitespace after max length
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "z"));           // invalid character after max length
}